

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::
SubjectFactoryTest_test_setting_fx_fwd_stream_with_Tenor_and_settlement_Test::
SubjectFactoryTest_test_setting_fx_fwd_stream_with_Tenor_and_settlement_Test
          (SubjectFactoryTest_test_setting_fx_fwd_stream_with_Tenor_and_settlement_Test *this)

{
  SubjectFactoryTest_test_setting_fx_fwd_stream_with_Tenor_and_settlement_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__SubjectFactoryTest_test_setting_fx_fwd_stream_with_Tenor_and_settlement_Test_003d3e28;
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_fx_fwd_stream_with_Tenor_and_settlement)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=Outright,Level=1,LiquidityProvider=CSFX,Quantity=3500000.00,RequestFor=Stream,SettlementDate=20190918,Symbol=EURGBP,Tenor=1Y,User=fbennett",
            subject_factory.Fx().Stream().Forward()
                    .CurrencyPair("EURGBP")
                    .Currency("EUR")
                    .Quantity(3500000)
                    .LiquidityProvider("CSFX")
                    .SettlementDate(new Date(2019, 9, 18))
                    .Tenor(Tenor::IN_1_YEAR)
                    .CreateSubject()
                    .ToString().c_str());
}